

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void sf2cute::SoundFont::RepairInstrumentReference
               (SFInstrument *instrument,
               unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
               *sample_map)

{
  SFInstrumentZone *instrument_zone_00;
  pointer puVar1;
  unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
  *instrument_zone;
  pointer puVar2;
  
  instrument_zone_00 =
       (instrument->global_zone_)._M_t.
       super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
       ._M_t.
       super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
       .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
  if (instrument_zone_00 != (SFInstrumentZone *)0x0) {
    RepairInstrumentZoneReference(instrument_zone_00,sample_map);
  }
  puVar1 = (instrument->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (instrument->zones_).
                super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    RepairInstrumentZoneReference
              ((puVar2->_M_t).
               super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
               ._M_t.
               super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
               .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl,sample_map);
  }
  return;
}

Assistant:

void SoundFont::RepairInstrumentReference(
    SFInstrument & instrument,
    const std::unordered_map<std::shared_ptr<SFSample>,
    std::shared_ptr<SFSample>> & sample_map) {
  // Repair global zone.
  if (instrument.has_global_zone()) {
    RepairInstrumentZoneReference(instrument.global_zone(), sample_map);
  }

  // Repair instrument zones.
  for (const auto & instrument_zone : instrument.zones()) {
    RepairInstrumentZoneReference(*instrument_zone, sample_map);
  }
}